

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

Vec_Ptr_t * Aig_ManDfsReverse(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj;
  long lVar3;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  
  Aig_ManIncrementTravId(p);
  lVar3 = (long)p->vCos->nSize;
  if (0 < lVar3) {
    ppvVar4 = p->vCos->pArray;
    iVar1 = p->nTravIds;
    lVar8 = 0;
    do {
      *(int *)((long)ppvVar4[lVar8] + 0x20) = iVar1;
      lVar8 = lVar8 + 1;
    } while (lVar3 != lVar8);
  }
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < (iVar2 + iVar1) - 1U) {
    iVar6 = iVar2 + iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar6 << 3);
  }
  vNodes->pArray = ppvVar4;
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar3 = 0;
    do {
      pObj = (Aig_Obj_t *)pVVar5->pArray[lVar3];
      if ((pObj != (Aig_Obj_t *)0x0) &&
         ((uVar7 = *(uint *)&pObj->field_0x18 & 7, uVar7 == 4 || (uVar7 - 5 < 2)))) {
        Aig_ManDfsReverse_rec(p,pObj,vNodes);
        pVVar5 = p->vObjs;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar5->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsReverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    // mark POs
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // go through the nodes
    vNodes = Vec_PtrAlloc( Aig_ManNodeNum(p) );
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) )
            Aig_ManDfsReverse_rec( p, pObj, vNodes );
    return vNodes;
}